

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O3

bool bc7decomp::unpack_bc7(void *pBlock,color_rgba *pPixels)

{
  int iVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((*pBlock & 1) == 0) {
    iVar1 = -1;
    do {
      iVar3 = iVar1;
      if (iVar3 == 6) {
        return false;
      }
      iVar1 = iVar3 + 1;
    } while ((*pBlock >> ((byte)(iVar3 + 1) & 0x1f) & 2) == 0);
    uVar4 = (ulong)(iVar3 + 2);
  }
  else {
    uVar4 = 0;
  }
  uVar2 = (*(code *)((long)&DAT_00121db0 + (long)(int)(&DAT_00121db0)[uVar4]))
                    (&DAT_00121db0,pBlock,pPixels);
  return (bool)uVar2;
}

Assistant:

bool unpack_bc7(const void *pBlock, color_rgba *pPixels)
{
	const uint32_t first_byte = static_cast<const uint8_t*>(pBlock)[0];

	for (uint32_t mode = 0; mode <= 7; mode++)
	{
		if (first_byte & (1U << mode))
		{
			switch (mode)
			{
			case 0:
			case 2:
				return unpack_bc7_mode0_2(mode, pBlock, pPixels);
			case 1:
			case 3:
			case 7:
				return unpack_bc7_mode1_3_7(mode, pBlock, pPixels);
			case 4:
			case 5:
				return unpack_bc7_mode4_5(mode, pBlock, pPixels);
			case 6:
				return unpack_bc7_mode6(pBlock, pPixels);
			default:
				break;
			}
		}
	}

	return false;
}